

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImageList.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIImageList::~CGUIImageList(CGUIImageList *this)

{
  CGUIImageList *in_RDI;
  
  ~CGUIImageList(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

CGUIImageList::~CGUIImageList()
{
	if (Driver) {
		Driver->drop();
	}

	if (Texture) {
		Texture->drop();
	}
}